

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_pragma_function_info.cpp
# Opt level: O3

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreatePragmaFunctionInfo::Copy(CreatePragmaFunctionInfo *this)

{
  type other;
  CreateFunctionInfo *in_RSI;
  _func_int **local_20;
  
  make_uniq<duckdb::CreatePragmaFunctionInfo,std::__cxx11::string_const&,duckdb::PragmaFunctionSet_const&>
            ((duckdb *)&local_20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1),
             (PragmaFunctionSet *)(in_RSI + 1));
  other = unique_ptr<duckdb::CreatePragmaFunctionInfo,_std::default_delete<duckdb::CreatePragmaFunctionInfo>,_true>
          ::operator*((unique_ptr<duckdb::CreatePragmaFunctionInfo,_std::default_delete<duckdb::CreatePragmaFunctionInfo>,_true>
                       *)&local_20);
  CreateFunctionInfo::CopyFunctionProperties(in_RSI,&other->super_CreateFunctionInfo);
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo = local_20;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreatePragmaFunctionInfo::Copy() const {
	auto result = make_uniq<CreatePragmaFunctionInfo>(functions.name, functions);
	CopyFunctionProperties(*result);
	return std::move(result);
}